

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O3

int ffprec(fitsfile *fptr,char *card,int *status)

{
  LONGLONG *pLVar1;
  int iVar2;
  FITSfile *pFVar3;
  size_t sVar4;
  __int32_t **pp_Var5;
  size_t sVar6;
  long lVar7;
  long lVar8;
  char tcard [81];
  char local_88 [80];
  undefined1 local_38;
  
  if (0 < *status) {
    return *status;
  }
  pFVar3 = fptr->Fptr;
  if (fptr->HDUposition != pFVar3->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    pFVar3 = fptr->Fptr;
  }
  if ((pFVar3->datastart - pFVar3->headend == 0x50) && (iVar2 = ffiblk(fptr,1,0,status), 0 < iVar2))
  {
    return *status;
  }
  strncpy(local_88,card,0x50);
  local_38 = 0;
  sVar4 = strlen(local_88);
  if (sVar4 == 0) {
LAB_001ae33c:
    memset(local_88 + sVar4,0x20,0x50 - sVar4);
  }
  else {
    sVar6 = 0;
    do {
      if ((byte)(local_88[sVar6] + 0x81U) < 0xa1) {
        local_88[sVar6] = ' ';
      }
      sVar6 = sVar6 + 1;
    } while (sVar4 != sVar6);
    if (sVar4 < 0x50) goto LAB_001ae33c;
  }
  lVar8 = 0x800000000;
  sVar4 = strcspn(local_88,"=");
  iVar2 = fits_strncasecmp("COMMENT ",local_88,8);
  if ((((iVar2 != 0) && (iVar2 = fits_strncasecmp("HISTORY ",local_88,8), iVar2 != 0)) &&
      (iVar2 = fits_strncasecmp("        ",local_88,8), iVar2 != 0)) &&
     (iVar2 = fits_strncasecmp("CONTINUE",local_88,8), iVar2 != 0)) {
    if ((int)sVar4 != 0x50) {
      lVar8 = sVar4 << 0x20;
    }
    if (lVar8 == 0) goto LAB_001ae40b;
  }
  pp_Var5 = __ctype_toupper_loc();
  lVar7 = 0;
  do {
    local_88[lVar7] = (char)(*pp_Var5)[local_88[lVar7]];
    lVar7 = lVar7 + 1;
  } while ((lVar8 >> 0x20) + (ulong)(lVar8 >> 0x20 == 0) != lVar7);
LAB_001ae40b:
  fftkey(local_88,status);
  ffmbyt(fptr,fptr->Fptr->headend,1,status);
  ffpbyt(fptr,0x50,local_88,status);
  iVar2 = *status;
  if (iVar2 < 1) {
    pLVar1 = &fptr->Fptr->headend;
    *pLVar1 = *pLVar1 + 0x50;
  }
  return iVar2;
}

Assistant:

int ffprec(fitsfile *fptr,     /* I - FITS file pointer        */
           const char *card,   /* I - string to be written     */
           int *status)        /* IO - error status            */
/*
  write a keyword record (80 bytes long) to the end of the header
*/
{
    char tcard[FLEN_CARD];
    size_t len, ii;
    long nblocks;
    int keylength;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if ( ((fptr->Fptr)->datastart - (fptr->Fptr)->headend) == 80) /* no room */
    {
        nblocks = 1;
        if (ffiblk(fptr, nblocks, 0, status) > 0) /* insert 2880-byte block */
            return(*status);  
    }

    strncpy(tcard,card,80);
    tcard[80] = '\0';

    len = strlen(tcard);

    /* silently replace any illegal characters with a space */
    for (ii=0; ii < len; ii++)   
        if (tcard[ii] < ' ' || tcard[ii] > 126) tcard[ii] = ' ';

    for (ii=len; ii < 80; ii++)    /* fill card with spaces if necessary */
        tcard[ii] = ' ';

    keylength = strcspn(tcard, "=");   /* support for free-format keywords */
    if (keylength == 80) keylength = 8;
    
    /* test for the common commentary keywords which by definition have 8-char names */
    if ( !fits_strncasecmp( "COMMENT ", tcard, 8) || !fits_strncasecmp( "HISTORY ", tcard, 8) ||
         !fits_strncasecmp( "        ", tcard, 8) || !fits_strncasecmp( "CONTINUE", tcard, 8) )
	 keylength = 8;

    for (ii=0; ii < keylength; ii++)       /* make sure keyword name is uppercase */
        tcard[ii] = toupper(tcard[ii]);

    fftkey(tcard, status);        /* test keyword name contains legal chars */

/*  no need to do this any more, since any illegal characters have been removed
    fftrec(tcard, status);  */        /* test rest of keyword for legal chars */

    ffmbyt(fptr, (fptr->Fptr)->headend, IGNORE_EOF, status); /* move to end */

    ffpbyt(fptr, 80, tcard, status);   /* write the 80 byte card */

    if (*status <= 0)
       (fptr->Fptr)->headend += 80;    /* update end-of-header position */

    return(*status);
}